

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O3

Abc_Cex_t * Saig_BmcGenerateCounterExample(Saig_Bmc_t *p)

{
  uint ivar;
  Vec_Int_t *p_00;
  bool bVar1;
  int iVar2;
  Abc_Cex_t *p_01;
  Aig_Obj_t *pAVar3;
  int Fill;
  Aig_Man_t *pAig;
  long lVar4;
  int i;
  
  p_01 = Abc_CexAlloc(p->pAig->nRegs,p->pAig->nTruePis,p->iFrameFail + 1);
  iVar2 = p->iFrameFail;
  p_01->iFrame = iVar2;
  p_01->iPo = p->iOutputFail;
  pAig = p->pAig;
  if (-1 < iVar2) {
    i = 0;
    do {
      if (0 < pAig->nTruePis) {
        lVar4 = 0;
        do {
          if (pAig->vCis->nSize <= lVar4) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pAVar3 = Saig_BmcObjFrame(p,(Aig_Obj_t *)pAig->vCis->pArray[lVar4],i);
          if (pAVar3 != (Aig_Obj_t *)0x0) {
            p_00 = p->vObj2Var;
            iVar2 = pAVar3->Id;
            Vec_IntFillExtra(p_00,iVar2 + 1,Fill);
            if (((long)iVar2 < 0) || (p_00->nSize <= iVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            ivar = p_00->pArray[iVar2];
            if ((ulong)ivar != 0) {
              if (p->pSat2 == (satoko_t *)0x0) {
                if (((int)ivar < 0) || (p->pSat->size <= (int)ivar)) {
                  __assert_fail("v >= 0 && v < s->size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                                ,0xda,"int sat_solver_var_value(sat_solver *, int)");
                }
                if (p->pSat->model[ivar] == 1) goto LAB_00565645;
              }
              else {
                iVar2 = satoko_read_cex_varvalue(p->pSat2,ivar);
                if (iVar2 != 0) {
LAB_00565645:
                  iVar2 = p->pAig->nTruePis * i + p_01->nRegs + (int)lVar4;
                  (&p_01[1].iPo)[iVar2 >> 5] =
                       (&p_01[1].iPo)[iVar2 >> 5] | 1 << ((byte)iVar2 & 0x1f);
                }
              }
            }
          }
          lVar4 = lVar4 + 1;
          pAig = p->pAig;
        } while (lVar4 < pAig->nTruePis);
        iVar2 = p->iFrameFail;
      }
      bVar1 = i < iVar2;
      i = i + 1;
    } while (bVar1);
  }
  iVar2 = Saig_ManVerifyCex(pAig,p_01);
  if (iVar2 == 0) {
    puts("Saig_BmcGenerateCounterExample(): Counter-example is invalid.");
    Abc_CexFree(p_01);
    p_01 = (Abc_Cex_t *)0x0;
  }
  return p_01;
}

Assistant:

Abc_Cex_t * Saig_BmcGenerateCounterExample( Saig_Bmc_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj, * pObjFrm;
    int i, f, iVarNum;
    // start the counter-example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), p->iFrameFail+1 );
    pCex->iFrame = p->iFrameFail;
    pCex->iPo    = p->iOutputFail;
    // copy the bit data
    for ( f = 0; f <= p->iFrameFail; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjFrm = Saig_BmcObjFrame( p, pObj, f );
            if ( pObjFrm == NULL )
                continue;
            iVarNum = Saig_BmcSatNum( p, pObjFrm );
            if ( iVarNum == 0 )
                continue;
            if ( p->pSat2 ? satoko_read_cex_varvalue(p->pSat2, iVarNum) : sat_solver_var_value(p->pSat, iVarNum) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + Saig_ManPiNum(p->pAig) * f + i );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p->pAig, pCex ) )
    {
        printf( "Saig_BmcGenerateCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;
}